

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O3

void * SoapySDRDevice_getNativeDeviceHandle(SoapySDRDevice *device)

{
  undefined1 *puVar1;
  void *pvVar2;
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014ce88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  pvVar2 = (void *)(**(code **)(*(long *)device + 0x3c8))(device);
  return pvVar2;
}

Assistant:

void* SoapySDRDevice_getNativeDeviceHandle(const SoapySDRDevice *device)
{
    __SOAPY_SDR_C_TRY
    return device->getNativeDeviceHandle();
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}